

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O0

void __thiscall HighsHessian::print(HighsHessian *this)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  uint *in_RDI;
  HighsInt iEl_1;
  int iRow;
  HighsInt iEl;
  HighsInt iCol_2;
  vector<double,_std::allocator<double>_> col;
  int iCol_1;
  int iCol;
  HighsInt num_nz;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar7;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  value_type vVar8;
  vector<double,_std::allocator<double>_> *this_00;
  int local_54;
  int local_50;
  int local_4c;
  uint local_48;
  vector<double,_std::allocator<double>_> local_30;
  int local_14;
  uint local_10;
  uint local_c;
  
  local_c = numNz((HighsHessian *)0x6b60d1);
  printf("Hessian of dimension %d and %d entries\n",(ulong)*in_RDI,(ulong)local_c);
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 2));
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 8));
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe));
  printf("Start; Index; Value of sizes %d; %d; %d\n",sVar1 & 0xffffffff,sVar2 & 0xffffffff,
         sVar3 & 0xffffffff);
  if (0 < (int)*in_RDI) {
    printf(" Row|");
    for (local_10 = 0; (int)local_10 < (int)*in_RDI; local_10 = local_10 + 1) {
      printf(" %4d",(ulong)local_10);
    }
    printf("\n");
    printf("-----");
    for (local_14 = 0; local_14 < (int)*in_RDI; local_14 = local_14 + 1) {
      printf("-----");
    }
    printf("\n");
    this_00 = &local_30;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x6b61f4);
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_ffffffffffffff80,
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (value_type_conflict1 *)0x6b6214);
    for (local_48 = 0; (int)local_48 < (int)*in_RDI; local_48 = local_48 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(int)local_48);
      for (local_4c = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),
                              (long)(int)(local_48 + 1)), local_4c < *pvVar4;
          local_4c = local_4c + 1) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_4c
                           );
        vVar8 = *pvVar5;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_4c);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,(long)*pvVar4);
        *pvVar6 = vVar8;
      }
      printf("%4d|",(ulong)local_48);
      for (local_50 = 0; local_50 < (int)*in_RDI; local_50 = local_50 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,(long)local_50);
        printf(" %4g",*pvVar6);
      }
      printf("\n");
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(int)local_48);
      local_54 = *pvVar4;
      while (iVar7 = local_54,
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),
                                (long)(int)(local_48 + 1)), iVar7 < *pvVar4) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_54);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,(long)*pvVar4);
        *pvVar6 = 0.0;
        local_54 = local_54 + 1;
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector(this_00);
  }
  return;
}

Assistant:

void HighsHessian::print() const {
  HighsInt num_nz = this->numNz();
  printf("Hessian of dimension %" HIGHSINT_FORMAT " and %" HIGHSINT_FORMAT
         " entries\n",
         dim_, num_nz);
  printf("Start; Index; Value of sizes %d; %d; %d\n", (int)this->start_.size(),
         (int)this->index_.size(), (int)this->value_.size());
  if (dim_ <= 0) return;
  printf(" Row|");
  for (int iCol = 0; iCol < dim_; iCol++) printf(" %4d", iCol);
  printf("\n");
  printf("-----");
  for (int iCol = 0; iCol < dim_; iCol++) printf("-----");
  printf("\n");
  std::vector<double> col;
  col.assign(dim_, 0);
  for (HighsInt iCol = 0; iCol < dim_; iCol++) {
    for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1]; iEl++)
      col[this->index_[iEl]] = this->value_[iEl];
    printf("%4d|", (int)iCol);
    for (int iRow = 0; iRow < dim_; iRow++) printf(" %4g", col[iRow]);
    printf("\n");
    for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1]; iEl++)
      col[this->index_[iEl]] = 0;
  }
}